

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::setIconSize(QAbstractItemView *this,QSize *size)

{
  bool bVar1;
  QAbstractItemViewPrivate *pQVar2;
  QAbstractItemViewPrivate *in_RSI;
  QSize *in_RDI;
  QAbstractItemViewPrivate *d;
  QSize *in_stack_ffffffffffffffd8;
  
  pQVar2 = d_func((QAbstractItemView *)0x803541);
  bVar1 = ::operator==(in_RDI,in_stack_ffffffffffffffd8);
  if (!bVar1) {
    pQVar2->iconSize =
         *(QSize *)&(in_RSI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                    super_QWidgetPrivate;
    QAbstractItemViewPrivate::doDelayedItemsLayout(in_RSI,(int)((ulong)pQVar2 >> 0x20));
    iconSizeChanged((QAbstractItemView *)in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QAbstractItemView::setIconSize(const QSize &size)
{
    Q_D(QAbstractItemView);
    if (size == d->iconSize)
        return;
    d->iconSize = size;
    d->doDelayedItemsLayout();
    emit iconSizeChanged(size);
}